

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O2

void __thiscall
stringToUnits_SIprefix_Test::stringToUnits_SIprefix_Test(stringToUnits_SIprefix_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00229ad8;
  return;
}

Assistant:

TEST(stringToUnits, SIprefix)
{
    EXPECT_EQ(precise_unit(1e18, precise::W), unit_from_string("EW"));
    EXPECT_EQ(precise_unit(1e-9, precise::H), unit_from_string("nH"));
    EXPECT_EQ(precise_unit(1e-15, precise::s), unit_from_string("fs"));

    EXPECT_EQ(unit(1e18, W), unit_cast_from_string("EW"));
    EXPECT_EQ(unit(1e-9, H), unit_cast_from_string("nH"));
    EXPECT_EQ(unit(1e-15, s), unit_cast_from_string("fs"));
}